

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

bool __thiscall Am_Priority_List::Member(Am_Priority_List *this,Am_Object *obj)

{
  Am_Priority_List_Item *pAVar1;
  bool bVar2;
  Am_Priority_List_Item *old_current;
  Am_Object *obj_local;
  Am_Priority_List *this_local;
  
  pAVar1 = this->current;
  while( true ) {
    if (this->current == (Am_Priority_List_Item *)0x0) {
      this->current = pAVar1;
      return false;
    }
    bVar2 = Am_Object::operator==(&this->current->obj,obj);
    if (bVar2) break;
    this->current = this->current->next;
  }
  return true;
}

Assistant:

bool
Am_Priority_List::Member(Am_Object obj)
{
  Am_Priority_List_Item *old_current = current;
  for (; current != nullptr; current = current->next) {
    if (current->obj == obj)
      return true;
  }
  current = old_current;
  return false;
}